

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::LocalDeclStatement(SQCompiler *this)

{
  SQInteger arg3;
  SQObjectValue this_00;
  SQFuncState *in_RDI;
  SQObject SVar1;
  SQFuncState *unaff_retaddr;
  SQInteger dest;
  SQInteger src;
  SQInteger in_stack_00000030;
  SQCompiler *in_stack_00000038;
  SQCompiler *in_stack_00000050;
  SQObject varname;
  SQObject *in_stack_00000078;
  SQCompiler *in_stack_00000080;
  SQCompiler *in_stack_ffffffffffffff90;
  SQFuncState *in_stack_ffffffffffffff98;
  SQInteger in_stack_ffffffffffffffa8;
  SQInteger in_stack_ffffffffffffffb0;
  SQOpcode in_stack_ffffffffffffffbc;
  SQFuncState *in_stack_ffffffffffffffc0;
  SQFuncState *name;
  
  name = in_RDI;
  Lex(in_stack_ffffffffffffff90);
  if (in_RDI->_returnexp == 0x11d) {
    Lex(in_stack_ffffffffffffff90);
    Expect(in_stack_00000038,in_stack_00000030);
    Expect(in_stack_00000038,in_stack_00000030);
    CreateFunction(in_stack_00000080,in_stack_00000078,this._7_1_);
    arg3 = SQFuncState::PushTarget(in_stack_ffffffffffffff98,(SQInteger)(in_RDI->_vlocals)._vals);
    sqvector<SQObjectPtr>::size((sqvector<SQObjectPtr> *)((in_RDI->_vlocals)._vals + 3));
    SQFuncState::AddInstruction
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffa8,(SQInteger)in_RDI,arg3);
    SQFuncState::PopTarget(in_RDI);
    SQFuncState::PushLocalVariable(unaff_retaddr,(SQObject *)name);
  }
  else {
    while( true ) {
      SVar1 = Expect(in_stack_00000038,in_stack_00000030);
      this_00 = SVar1._unVal;
      if (in_RDI->_returnexp == 0x3d) {
        Lex(in_stack_ffffffffffffff90);
        Expression(in_stack_00000050);
        in_stack_ffffffffffffffb0 = SQFuncState::PopTarget(in_RDI);
        in_stack_ffffffffffffffa8 =
             SQFuncState::PushTarget(in_stack_ffffffffffffff98,(SQInteger)in_stack_ffffffffffffff90)
        ;
        if (in_stack_ffffffffffffffa8 != in_stack_ffffffffffffffb0) {
          SQFuncState::AddInstruction
                    ((SQFuncState *)this_00.pTable,in_stack_ffffffffffffffbc,
                     in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(SQInteger)in_RDI,
                     (SQInteger)in_stack_ffffffffffffff98);
        }
      }
      else {
        SQFuncState::PushTarget(in_stack_ffffffffffffff98,(SQInteger)in_stack_ffffffffffffff90);
        SQFuncState::AddInstruction
                  ((SQFuncState *)this_00.pTable,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0
                   ,in_stack_ffffffffffffffa8,(SQInteger)in_RDI,(SQInteger)in_stack_ffffffffffffff98
                  );
      }
      SQFuncState::PopTarget(in_RDI);
      SQFuncState::PushLocalVariable(unaff_retaddr,(SQObject *)name);
      if (in_RDI->_returnexp != 0x2c) break;
      Lex(in_stack_ffffffffffffff90);
    }
  }
  return;
}

Assistant:

void LocalDeclStatement()
    {
        SQObject varname;
        Lex();
        if( _token == TK_FUNCTION) {
            Lex();
            varname = Expect(TK_IDENTIFIER);
            Expect(_SC('('));
            CreateFunction(varname,false);
            _fs->AddInstruction(_OP_CLOSURE, _fs->PushTarget(), _fs->_functions.size() - 1, 0);
            _fs->PopTarget();
            _fs->PushLocalVariable(varname);
            return;
        }

        do {
            varname = Expect(TK_IDENTIFIER);
            if(_token == _SC('=')) {
                Lex(); Expression();
                SQInteger src = _fs->PopTarget();
                SQInteger dest = _fs->PushTarget();
                if(dest != src) _fs->AddInstruction(_OP_MOVE, dest, src);
            }
            else{
                _fs->AddInstruction(_OP_LOADNULLS, _fs->PushTarget(),1);
            }
            _fs->PopTarget();
            _fs->PushLocalVariable(varname);
            if(_token == _SC(',')) Lex(); else break;
        } while(1);
    }